

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emit_dfa.cc
# Opt level: O3

void __thiscall
re2c::DFA::emit(DFA *this,Output *output,uint32_t *ind,bool isLastCond,bool *bPrologBrace)

{
  counter_t<re2c::label_t> *this_00;
  label_t start;
  State *pSVar1;
  pointer pbVar2;
  pointer pbVar3;
  long lVar4;
  pointer pcVar5;
  int iVar6;
  BitMap *pBVar7;
  bool bVar8;
  opt_t *poVar9;
  OutputFile *pOVar10;
  Output *this_01;
  const_iterator cVar11;
  uint32_t uVar12;
  undefined7 in_register_00000009;
  long lVar13;
  uint64_t n;
  long lVar14;
  char *pcVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  byte bVar16;
  string *psVar17;
  uint cMax;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar18;
  label_t start_label;
  uint32_t i;
  set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_> used_labels;
  label_t local_c4;
  key_type local_bc;
  string local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_98;
  bool *local_90;
  undefined4 local_84;
  long *local_80 [2];
  long local_70 [2];
  _Rb_tree<re2c::label_t,_re2c::label_t,_std::_Identity<re2c::label_t>,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_>
  local_60;
  
  local_84 = (undefined4)CONCAT71(in_register_00000009,isLastCond);
  local_90 = bPrologBrace;
  poVar9 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
  bVar16 = bWroteCondCheck & poVar9->cFlag;
  this_00 = &(output->source).label_counter;
  start.value = (output->source).label_counter.num.value;
  label_t::inc(&this_00->num);
  local_c4.value = start.value;
  local_bc.value = start.value;
  if ((bVar16 == 0) &&
     (poVar9 = realopt_t::operator->((realopt_t *)&DAT_0015c868), poVar9->cFlag == true)) {
    local_c4.value = (this_00->num).value;
    label_t::inc(&this_00->num);
  }
  for (pSVar1 = this->head; pSVar1 != (State *)0x0; pSVar1 = pSVar1->next) {
    uVar12 = (this_00->num).value;
    label_t::inc(&this_00->num);
    (pSVar1->label).value = uVar12;
    start.value = local_bc.value;
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar8 = OutputFile::get_force_start_label(&output->source);
  value = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)bVar8;
  count_used_labels(this,(set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_>
                          *)&local_60,start,local_c4,bVar8);
  Action::set_initial(&this->head->action,local_c4,(this->head->action).type == SAVE);
  Skeleton::warn_undefined_control_flow(this->skeleton);
  Skeleton::warn_unreachable_rules(this->skeleton);
  Skeleton::warn_match_empty(this->skeleton);
  poVar9 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
  if (poVar9->target == SKELETON) {
    pVar18 = std::
             _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
             ::_M_insert_unique<std::__cxx11::string_const&>
                       ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                         *)&output->skeletons,&this->name);
    if (((undefined1  [16])pVar18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      Skeleton::emit_data(this->skeleton,(output->source).file_name);
      Skeleton::emit_start
                (this->skeleton,&output->source,this->max_fill,this->need_backup,
                 this->need_backupctx,this->need_accept);
      local_b8._M_dataplus._M_p._0_4_ = 2;
      emit_body(this,&output->source,(uint32_t *)&local_b8,
                (set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_> *)
                &local_60,local_c4);
      Skeleton::emit_end(this->skeleton,&output->source,this->need_backup,this->need_backupctx);
    }
    goto LAB_0011d572;
  }
  if (bVar16 == 0) {
    pOVar10 = OutputFile::ws(&output->source,"\n");
    OutputFile::wdelay_line_info(pOVar10);
    poVar9 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
    if (poVar9->target == DOT) {
      *local_90 = true;
      pcVar15 = "digraph re2c {\n";
      this_01 = output;
LAB_0011cb8b:
      OutputFile::ws(&this_01->source,pcVar15);
    }
    else {
      poVar9 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
      if ((((((poVar9->fFlag == false) &&
             (bVar8 = OutputFile::get_used_yyaccept(&output->source), bVar8)) ||
            ((poVar9 = realopt_t::operator->((realopt_t *)&DAT_0015c868), poVar9->fFlag == false &&
             (poVar9 = realopt_t::operator->((realopt_t *)&DAT_0015c868), poVar9->bEmitYYCh != false
             )))) || (((poVar9 = realopt_t::operator->((realopt_t *)&DAT_0015c868),
                       poVar9->bFlag == true &&
                       (poVar9 = realopt_t::operator->((realopt_t *)&DAT_0015c868),
                       poVar9->cFlag == false)) && (BitMap::first != (BitMap *)0x0)))) ||
          (((poVar9 = realopt_t::operator->((realopt_t *)&DAT_0015c868), poVar9->cFlag == true &&
            (bWroteCondCheck == 0)) &&
           (poVar9 = realopt_t::operator->((realopt_t *)&DAT_0015c868), poVar9->gFlag != false))))
         || (((poVar9 = realopt_t::operator->((realopt_t *)&DAT_0015c868), poVar9->fFlag == true &&
              (bWroteGetState == '\0')) &&
             (poVar9 = realopt_t::operator->((realopt_t *)&DAT_0015c868), poVar9->gFlag == true))))
      {
        *local_90 = true;
        uVar12 = *ind;
        *ind = uVar12 + 1;
        this_01 = (Output *)OutputFile::wind(&output->source,uVar12);
        pcVar15 = "{\n";
        goto LAB_0011cb8b;
      }
      if (*ind == 0) {
        *ind = 1;
      }
    }
    poVar9 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
    if ((poVar9->fFlag == false) &&
       (poVar9 = realopt_t::operator->((realopt_t *)&DAT_0015c868), poVar9->target != DOT)) {
      poVar9 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
      if (poVar9->bEmitYYCh == true) {
        pOVar10 = OutputFile::wind(&output->source,*ind);
        poVar9 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
        pOVar10 = OutputFile::wstring(pOVar10,&poVar9->yyctype);
        pOVar10 = OutputFile::ws(pOVar10," ");
        poVar9 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
        pOVar10 = OutputFile::wstring(pOVar10,&poVar9->yych);
        OutputFile::ws(pOVar10,";\n");
      }
      OutputFile::wdelay_yyaccept_init(&output->source,*ind);
    }
    else {
      OutputFile::ws(&output->source,"\n");
    }
  }
  poVar9 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
  if (((poVar9->bFlag == true) &&
      (poVar9 = realopt_t::operator->((realopt_t *)&DAT_0015c868), poVar9->cFlag == false)) &&
     (BitMap::first != (BitMap *)0x0)) {
    uVar12 = 0x100;
    if (this->ubChar < 0x100) {
      uVar12 = this->ubChar;
    }
    BitMap::gen(&output->source,*ind,this->lbChar,uVar12);
  }
  if (bVar16 == 0) {
    poVar9 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
    if (((poVar9->cFlag == true) && (bWroteCondCheck == 0)) &&
       (poVar9 = realopt_t::operator->((realopt_t *)&DAT_0015c868), poVar9->gFlag == true)) {
      local_98 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(ulong)*ind;
      pbVar2 = (output->types).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar3 = (output->types).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pOVar10 = OutputFile::wind(&output->source,*ind);
      pOVar10 = OutputFile::ws(pOVar10,"static void *");
      poVar9 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
      pOVar10 = OutputFile::wstring(pOVar10,&poVar9->yyctable);
      pOVar10 = OutputFile::ws(pOVar10,"[");
      n = (long)pbVar3 - (long)pbVar2 >> 5;
      pOVar10 = OutputFile::wu64(pOVar10,n);
      OutputFile::ws(pOVar10,"] = {\n");
      if (pbVar3 != pbVar2) {
        iVar6 = (int)local_98;
        lVar14 = n + (n == 0);
        lVar13 = 0;
        do {
          pOVar10 = OutputFile::wind(&output->source,iVar6 + 1);
          pOVar10 = OutputFile::ws(pOVar10,"&&");
          poVar9 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
          pOVar10 = OutputFile::wstring(pOVar10,&poVar9->condPrefix);
          pOVar10 = OutputFile::wstring(pOVar10,(string *)
                                                ((long)&(((output->types).
                                                                                                                    
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar13));
          OutputFile::ws(pOVar10,",\n");
          lVar13 = lVar13 + 0x20;
          lVar14 = lVar14 + -1;
        } while (lVar14 != 0);
      }
      pOVar10 = OutputFile::wind(&output->source,(uint32_t)local_98);
      OutputFile::ws(pOVar10,"};\n");
    }
    OutputFile::wdelay_state_goto(&output->source,*ind);
    poVar9 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
    if (((poVar9->cFlag == true) &&
        (poVar9 = realopt_t::operator->((realopt_t *)&DAT_0015c868), poVar9->target != DOT)) &&
       (cVar11 = std::
                 _Rb_tree<re2c::label_t,_re2c::label_t,_std::_Identity<re2c::label_t>,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_>
                 ::find(&local_60,&local_bc),
       (_Rb_tree_header *)cVar11._M_node != &local_60._M_impl.super__Rb_tree_header)) {
      poVar9 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
      pOVar10 = OutputFile::wstring(&output->source,&poVar9->labelPrefix);
      pOVar10 = OutputFile::wlabel(pOVar10,(label_t)local_bc.value);
      OutputFile::ws(pOVar10,":\n");
    }
    OutputFile::wuser_start_label(&output->source);
    poVar9 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
    if ((poVar9->cFlag == true) && (bWroteCondCheck == 0)) {
      uVar12 = *ind;
      pbVar2 = (output->types).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar3 = (output->types).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      poVar9 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
      local_98 = &output->types;
      lVar13 = (long)pbVar3 - (long)pbVar2 >> 5;
      if (poVar9->target == DOT) {
        (output->source).warn_condition_order = false;
        if (pbVar3 != pbVar2) {
          lVar13 = lVar13 + (ulong)(lVar13 == 0);
          lVar14 = 8;
          do {
            pbVar2 = (local_98->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            lVar4 = *(long *)((long)pbVar2 + lVar14 + -8);
            local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b8,lVar4,
                       *(long *)((long)&(pbVar2->_M_dataplus)._M_p + lVar14) + lVar4);
            pOVar10 = OutputFile::ws(&output->source,"0 -> ");
            pOVar10 = OutputFile::wstring(pOVar10,&local_b8);
            pOVar10 = OutputFile::ws(pOVar10," [label=\"state=");
            pOVar10 = OutputFile::wstring(pOVar10,&local_b8);
            OutputFile::ws(pOVar10,"\"]\n");
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
            }
            lVar14 = lVar14 + 0x20;
            lVar13 = lVar13 + -1;
          } while (lVar13 != 0);
        }
      }
      else {
        poVar9 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
        if (poVar9->gFlag == true) {
          pOVar10 = OutputFile::wind(&output->source,uVar12);
          pOVar10 = OutputFile::ws(pOVar10,"goto *");
          poVar9 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
          pOVar10 = OutputFile::wstring(pOVar10,&poVar9->yyctable);
          pOVar10 = OutputFile::ws(pOVar10,"[");
          genGetCondition_abi_cxx11_();
          pOVar10 = OutputFile::wstring(pOVar10,&local_b8);
          OutputFile::ws(pOVar10,"];\n");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          poVar9 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
          if (poVar9->sFlag == true) {
            if ((long)pbVar3 - (long)pbVar2 == 0x20) {
              (output->source).warn_condition_order = false;
            }
            cMax = (int)lVar13 - 1;
            value = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)cMax
            ;
            genCondGotoSub(&output->source,uVar12,local_98,0,cMax);
          }
          else {
            (output->source).warn_condition_order = false;
            pOVar10 = OutputFile::wind(&output->source,uVar12);
            pOVar10 = OutputFile::ws(pOVar10,"switch (");
            genGetCondition_abi_cxx11_();
            pOVar10 = OutputFile::wstring(pOVar10,&local_b8);
            OutputFile::ws(pOVar10,") {\n");
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
            }
            if (pbVar3 != pbVar2) {
              lVar13 = lVar13 + (ulong)(lVar13 == 0);
              lVar14 = 0;
              do {
                psVar17 = (string *)
                          ((long)&(((output->types).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          lVar14);
                pOVar10 = OutputFile::wind(&output->source,uVar12);
                pOVar10 = OutputFile::ws(pOVar10,"case ");
                poVar9 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
                pOVar10 = OutputFile::wstring(pOVar10,&poVar9->condEnumPrefix);
                pOVar10 = OutputFile::wstring(pOVar10,psVar17);
                pOVar10 = OutputFile::ws(pOVar10,": goto ");
                poVar9 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
                pOVar10 = OutputFile::wstring(pOVar10,&poVar9->condPrefix);
                pOVar10 = OutputFile::wstring(pOVar10,psVar17);
                OutputFile::ws(pOVar10,";\n");
                lVar14 = lVar14 + 0x20;
                lVar13 = lVar13 + -1;
              } while (lVar13 != 0);
            }
            pOVar10 = OutputFile::wind(&output->source,uVar12);
            OutputFile::ws(pOVar10,"}\n");
          }
        }
      }
      OutputFile::wdelay_warn_condition_order(&output->source);
      bWroteCondCheck = 1;
    }
  }
  poVar9 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
  if ((poVar9->cFlag == true) && ((this->cond)._M_string_length != 0)) {
    poVar9 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
    psVar17 = &this->cond;
    if ((poVar9->condDivider)._M_string_length != 0) {
      poVar9 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
      pcVar5 = (poVar9->condDivider)._M_dataplus._M_p;
      local_80[0] = local_70;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_80,pcVar5,pcVar5 + (poVar9->condDivider)._M_string_length);
      poVar9 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
      replaceParam<std::__cxx11::string>
                (&local_b8,(re2c *)local_80,&poVar9->condDividerParam,psVar17,value);
      pOVar10 = OutputFile::wstring(&output->source,&local_b8);
      OutputFile::ws(pOVar10,"\n");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if (local_80[0] != local_70) {
        operator_delete(local_80[0],local_70[0] + 1);
      }
    }
    poVar9 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
    if (poVar9->target == DOT) {
      pOVar10 = OutputFile::wstring(&output->source,psVar17);
      pOVar10 = OutputFile::ws(pOVar10," -> ");
      pOVar10 = OutputFile::wlabel(pOVar10,(label_t)(this->head->label).value);
      pcVar15 = "\n";
    }
    else {
      poVar9 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
      pOVar10 = OutputFile::wstring(&output->source,&poVar9->condPrefix);
      pOVar10 = OutputFile::wstring(pOVar10,psVar17);
      pcVar15 = ":\n";
    }
    OutputFile::ws(pOVar10,pcVar15);
  }
  poVar9 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
  if (((poVar9->cFlag == true) &&
      (poVar9 = realopt_t::operator->((realopt_t *)&DAT_0015c868), poVar9->bFlag == true)) &&
     (BitMap::first != (BitMap *)0x0)) {
    uVar12 = *ind;
    *ind = uVar12 + 1;
    pOVar10 = OutputFile::wind(&output->source,uVar12);
    OutputFile::ws(pOVar10,"{\n");
    uVar12 = 0x100;
    if (this->ubChar < 0x100) {
      uVar12 = this->ubChar;
    }
    BitMap::gen(&output->source,*ind,this->lbChar,uVar12);
  }
  emit_body(this,&output->source,ind,
            (set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_> *)
            &local_60,local_c4);
  poVar9 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
  if (((poVar9->cFlag == true) &&
      (poVar9 = realopt_t::operator->((realopt_t *)&DAT_0015c868), poVar9->bFlag == true)) &&
     (BitMap::first != (BitMap *)0x0)) {
    uVar12 = *ind;
    *ind = uVar12 - 1;
    pOVar10 = OutputFile::wind(&output->source,uVar12 - 1);
    OutputFile::ws(pOVar10,"}\n");
  }
  poVar9 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
  if (((byte)(poVar9->cFlag ^ 1U | (byte)local_84) == 1) && (*local_90 == true)) {
    uVar12 = *ind;
    *ind = uVar12 - 1;
    pOVar10 = OutputFile::wind(&output->source,uVar12 - 1);
    OutputFile::ws(pOVar10,"}\n");
  }
LAB_0011d572:
  pBVar7 = BitMap::first;
  if (BitMap::first != (BitMap *)0x0) {
    BitMap::~BitMap(BitMap::first);
    operator_delete(pBVar7,0x20);
    BitMap::first = (BitMap *)0x0;
  }
  std::
  _Rb_tree<re2c::label_t,_re2c::label_t,_std::_Identity<re2c::label_t>,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void DFA::emit(Output & output, uint32_t& ind, bool isLastCond, bool& bPrologBrace)
{
	OutputFile & o = output.source;

	bool bProlog = (!opts->cFlag || !bWroteCondCheck);

	// start_label points to the beginning of current re2c block
	// (prior to condition dispatch in '-c' mode)
	// it can forced by configuration 're2c:startlabel = <integer>;'
	label_t start_label = o.label_counter.next ();
	// initial_label points to the beginning of DFA
	// in '-c' mode this is NOT equal to start_label
	label_t initial_label = bProlog && opts->cFlag
		? o.label_counter.next ()
		: start_label;
	for (State * s = head; s; s = s->next)
	{
		s->label = o.label_counter.next ();
	}
	std::set<label_t> used_labels;
	count_used_labels (used_labels, start_label, initial_label, o.get_force_start_label ());

	head->action.set_initial (initial_label, head->action.type == Action::SAVE);

	skeleton->warn_undefined_control_flow ();
	skeleton->warn_unreachable_rules ();
	skeleton->warn_match_empty ();

	if (opts->target == opt_t::SKELETON)
	{
		if (output.skeletons.insert (name).second)
		{
			skeleton->emit_data (o.file_name);
			skeleton->emit_start (o, max_fill, need_backup, need_backupctx, need_accept);
			uint32_t i = 2;
			emit_body (o, i, used_labels, initial_label);
			skeleton->emit_end (o, need_backup, need_backupctx);
		}
	}
	else
	{
		// Generate prolog
		if (bProlog)
		{
			o.ws("\n").wdelay_line_info ();
			if (opts->target == opt_t::DOT)
			{
				bPrologBrace = true;
				o.ws("digraph re2c {\n");
			}
			else if ((!opts->fFlag && o.get_used_yyaccept ())
			||  (!opts->fFlag && opts->bEmitYYCh)
			||  (opts->bFlag && !opts->cFlag && BitMap::first)
			||  (opts->cFlag && !bWroteCondCheck && opts->gFlag)
			||  (opts->fFlag && !bWroteGetState && opts->gFlag)
			)
			{
				bPrologBrace = true;
				o.wind(ind++).ws("{\n");
			}
			else if (ind == 0)
			{
				ind = 1;
			}
			if (!opts->fFlag && opts->target != opt_t::DOT)
			{
				if (opts->bEmitYYCh)
				{
					o.wind(ind).wstring(opts->yyctype).ws(" ").wstring(opts->yych).ws(";\n");
				}
				o.wdelay_yyaccept_init (ind);
			}
			else
			{
				o.ws("\n");
			}
		}
		if (opts->bFlag && !opts->cFlag && BitMap::first)
		{
			BitMap::gen(o, ind, lbChar, ubChar <= 256 ? ubChar : 256);
		}
		if (bProlog)
		{
			if (opts->cFlag && !bWroteCondCheck && opts->gFlag)
			{
				genCondTable(o, ind, output.types);
			}
			o.wdelay_state_goto (ind);
			if (opts->cFlag && opts->target != opt_t::DOT)
			{
				if (used_labels.count(start_label))
				{
					o.wstring(opts->labelPrefix).wlabel(start_label).ws(":\n");
				}
			}
			o.wuser_start_label ();
			if (opts->cFlag && !bWroteCondCheck)
			{
				genCondGoto(o, ind, output.types);
			}
		}
		if (opts->cFlag && !cond.empty())
		{
			if (opts->condDivider.length())
			{
				o.wstring(replaceParam(opts->condDivider, opts->condDividerParam, cond)).ws("\n");
			}
			if (opts->target == opt_t::DOT)
			{
				o.wstring(cond).ws(" -> ").wlabel(head->label).ws("\n");
			}
			else
			{
				o.wstring(opts->condPrefix).wstring(cond).ws(":\n");
			}
		}
		if (opts->cFlag && opts->bFlag && BitMap::first)
		{
			o.wind(ind++).ws("{\n");
			BitMap::gen(o, ind, lbChar, ubChar <= 256 ? ubChar : 256);
		}
		// Generate code
		emit_body (o, ind, used_labels, initial_label);
		if (opts->cFlag && opts->bFlag && BitMap::first)
		{
			o.wind(--ind).ws("}\n");
		}
		// Generate epilog
		if ((!opts->cFlag || isLastCond) && bPrologBrace)
		{
			o.wind(--ind).ws("}\n");
		}
	}

	// Cleanup
	if (BitMap::first)
	{
		delete BitMap::first;
		BitMap::first = NULL;
	}
}